

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  undefined1 auVar24 [16];
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong unaff_R12;
  size_t mask;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  float fVar44;
  float fVar45;
  undefined1 auVar38 [16];
  float fVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar79;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar102;
  float fVar103;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  undefined1 auVar98 [16];
  float fVar104;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  float fVar118;
  float fVar119;
  float fVar124;
  float fVar126;
  undefined1 auVar120 [16];
  float fVar128;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar127;
  float fVar129;
  undefined1 auVar123 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar137 [16];
  float fVar138;
  float fVar140;
  float fVar141;
  undefined1 auVar139 [16];
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [16];
  float fVar148;
  undefined1 auVar145 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_afc;
  undefined1 local_af8 [16];
  undefined8 local_ae8;
  float fStack_ae0;
  float fStack_adc;
  ulong local_ad0;
  NodeRef *local_ac8;
  ulong local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  undefined1 local_a98 [16];
  ulong local_a88;
  ulong local_a80;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  UVIdentity<4> *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar24 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar81 = ray->tfar;
    if (0.0 <= fVar81) {
      local_ac8 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar4 = (ray->dir).field_0;
      auVar59 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83 = vandps_avx((undefined1  [16])aVar4,auVar83);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar83 = vcmpps_avx(auVar83,auVar95,1);
      auVar96._8_4_ = 0x3f800000;
      auVar96._0_8_ = &DAT_3f8000003f800000;
      auVar96._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar96,(undefined1  [16])aVar4);
      auVar97._8_4_ = 0x5d5e0b6b;
      auVar97._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar97._12_4_ = 0x5d5e0b6b;
      auVar83 = vblendvps_avx(auVar95,auVar97,auVar83);
      auVar84._0_4_ = auVar83._0_4_ * 0.99999964;
      auVar84._4_4_ = auVar83._4_4_ * 0.99999964;
      auVar84._8_4_ = auVar83._8_4_ * 0.99999964;
      auVar84._12_4_ = auVar83._12_4_ * 0.99999964;
      auVar68._0_4_ = auVar83._0_4_ * 1.0000004;
      auVar68._4_4_ = auVar83._4_4_ * 1.0000004;
      auVar68._8_4_ = auVar83._8_4_ * 1.0000004;
      auVar68._12_4_ = auVar83._12_4_ * 1.0000004;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_a98._4_4_ = uVar2;
      local_a98._0_4_ = uVar2;
      local_a98._8_4_ = uVar2;
      local_a98._12_4_ = uVar2;
      auVar117 = ZEXT1664(local_a98);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar96 = vshufps_avx(auVar84,auVar84,0);
      auVar83 = vmovshdup_avx(auVar84);
      auVar97 = vshufps_avx(auVar84,auVar84,0x55);
      auVar95 = vshufpd_avx(auVar84,auVar84,1);
      auVar21 = vshufps_avx(auVar84,auVar84,0xaa);
      auVar22 = vshufps_avx(auVar68,auVar68,0);
      local_ad0 = (ulong)(auVar84._0_4_ < 0.0) << 4;
      auVar84 = vshufps_avx(auVar68,auVar68,0x55);
      auVar68 = vshufps_avx(auVar68,auVar68,0xaa);
      uVar31 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x20;
      uVar32 = (ulong)(auVar95._0_4_ < 0.0) << 4 | 0x40;
      uVar35 = local_ad0 ^ 0x10;
      uVar36 = uVar31 ^ 0x10;
      local_ac0 = uVar32 ^ 0x10;
      auVar83 = vshufps_avx(auVar59,auVar59,0);
      auVar95 = vshufps_avx(ZEXT416((uint)fVar81),ZEXT416((uint)fVar81),0);
      uVar34 = local_ac0;
      local_ab8 = uVar36;
      local_ab0 = uVar35;
      local_aa8 = uVar32;
      local_aa0 = uVar31;
      do {
        if (local_ac8 == stack) {
          return;
        }
        uVar29 = local_ac8[-1].ptr;
        local_ac8 = local_ac8 + -1;
        do {
          if ((uVar29 & 8) == 0) {
            auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + local_ad0),auVar117._0_16_);
            local_8d8 = auVar96._0_4_;
            fStack_8d4 = auVar96._4_4_;
            fStack_8d0 = auVar96._8_4_;
            fStack_8cc = auVar96._12_4_;
            auVar38._0_4_ = auVar59._0_4_ * local_8d8;
            auVar38._4_4_ = auVar59._4_4_ * fStack_8d4;
            auVar38._8_4_ = auVar59._8_4_ * fStack_8d0;
            auVar38._12_4_ = auVar59._12_4_ * fStack_8cc;
            auVar111._4_4_ = uVar2;
            auVar111._0_4_ = uVar2;
            auVar111._8_4_ = uVar2;
            auVar111._12_4_ = uVar2;
            auVar59 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar31),auVar111);
            local_8e8 = auVar97._0_4_;
            fStack_8e4 = auVar97._4_4_;
            fStack_8e0 = auVar97._8_4_;
            fStack_8dc = auVar97._12_4_;
            auVar47._0_4_ = auVar59._0_4_ * local_8e8;
            auVar47._4_4_ = auVar59._4_4_ * fStack_8e4;
            auVar47._8_4_ = auVar59._8_4_ * fStack_8e0;
            auVar47._12_4_ = auVar59._12_4_ * fStack_8dc;
            auVar59 = vmaxps_avx(auVar38,auVar47);
            auVar110._4_4_ = uVar3;
            auVar110._0_4_ = uVar3;
            auVar110._8_4_ = uVar3;
            auVar110._12_4_ = uVar3;
            auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar32),auVar110);
            local_8f8 = auVar21._0_4_;
            fStack_8f4 = auVar21._4_4_;
            fStack_8f0 = auVar21._8_4_;
            fStack_8ec = auVar21._12_4_;
            auVar48._0_4_ = auVar38._0_4_ * local_8f8;
            auVar48._4_4_ = auVar38._4_4_ * fStack_8f4;
            auVar48._8_4_ = auVar38._8_4_ * fStack_8f0;
            auVar48._12_4_ = auVar38._12_4_ * fStack_8ec;
            auVar38 = vmaxps_avx(auVar48,auVar83);
            auVar59 = vmaxps_avx(auVar59,auVar38);
            auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar35),auVar117._0_16_);
            local_908 = auVar22._0_4_;
            fStack_904 = auVar22._4_4_;
            fStack_900 = auVar22._8_4_;
            fStack_8fc = auVar22._12_4_;
            auVar49._0_4_ = auVar38._0_4_ * local_908;
            auVar49._4_4_ = auVar38._4_4_ * fStack_904;
            auVar49._8_4_ = auVar38._8_4_ * fStack_900;
            auVar49._12_4_ = auVar38._12_4_ * fStack_8fc;
            auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar36),auVar111);
            local_918 = auVar84._0_4_;
            fStack_914 = auVar84._4_4_;
            fStack_910 = auVar84._8_4_;
            fStack_90c = auVar84._12_4_;
            auVar56._0_4_ = auVar38._0_4_ * local_918;
            auVar56._4_4_ = auVar38._4_4_ * fStack_914;
            auVar56._8_4_ = auVar38._8_4_ * fStack_910;
            auVar56._12_4_ = auVar38._12_4_ * fStack_90c;
            auVar38 = vminps_avx(auVar49,auVar56);
            auVar110 = vsubps_avx(*(undefined1 (*) [16])(uVar29 + 0x20 + uVar34),auVar110);
            local_928 = auVar68._0_4_;
            fStack_924 = auVar68._4_4_;
            fStack_920 = auVar68._8_4_;
            fStack_91c = auVar68._12_4_;
            auVar57._0_4_ = auVar110._0_4_ * local_928;
            auVar57._4_4_ = auVar110._4_4_ * fStack_924;
            auVar57._8_4_ = auVar110._8_4_ * fStack_920;
            auVar57._12_4_ = auVar110._12_4_ * fStack_91c;
            auVar110 = vminps_avx(auVar57,auVar95);
            auVar38 = vminps_avx(auVar38,auVar110);
            auVar59 = vcmpps_avx(auVar59,auVar38,2);
            uVar33 = vmovmskps_avx(auVar59);
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar33);
          }
          if ((uVar29 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar30 = 4;
            }
            else {
              uVar28 = uVar29 & 0xfffffffffffffff0;
              lVar26 = 0;
              if (unaff_R12 != 0) {
                for (; (unaff_R12 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              iVar30 = 0;
              uVar29 = *(ulong *)(uVar28 + lVar26 * 8);
              uVar27 = unaff_R12 - 1 & unaff_R12;
              if (uVar27 != 0) {
                local_ac8->ptr = uVar29;
                lVar26 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                  }
                }
                uVar25 = uVar27 - 1;
                while( true ) {
                  local_ac8 = local_ac8 + 1;
                  uVar29 = *(ulong *)(uVar28 + lVar26 * 8);
                  uVar25 = uVar25 & uVar27;
                  if (uVar25 == 0) break;
                  local_ac8->ptr = uVar29;
                  lVar26 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                    }
                  }
                  uVar27 = uVar25 - 1;
                }
              }
            }
          }
          else {
            iVar30 = 6;
          }
        } while (iVar30 == 0);
        uVar28 = uVar34;
        if (iVar30 == 6) {
          iVar30 = 0;
          local_a88 = (ulong)((uint)uVar29 & 0xf) - 8;
          bVar37 = local_a88 != 0;
          if (bVar37) {
            uVar29 = uVar29 & 0xfffffffffffffff0;
            pSVar5 = context->scene;
            local_a80 = 0;
            do {
              lVar26 = local_a80 * 0x50;
              ppfVar6 = (pSVar5->vertices).items;
              pfVar7 = ppfVar6[*(uint *)(uVar29 + 0x30 + lVar26)];
              pfVar8 = ppfVar6[*(uint *)(uVar29 + 0x34 + lVar26)];
              pfVar9 = ppfVar6[*(uint *)(uVar29 + 0x38 + lVar26)];
              pfVar10 = ppfVar6[*(uint *)(uVar29 + 0x3c + lVar26)];
              auVar110 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar29 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar29 + 8 + lVar26)));
              auVar59 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar29 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar29 + 8 + lVar26)));
              auVar111 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar29 + 4 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar29 + 0xc + lVar26)));
              auVar38 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar29 + 4 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar29 + 0xc + lVar26)));
              auVar48 = vunpcklps_avx(auVar59,auVar38);
              auVar49 = vunpcklps_avx(auVar110,auVar111);
              auVar38 = vunpckhps_avx(auVar110,auVar111);
              auVar111 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar29 + 0x10 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar29 + 0x18 + lVar26)));
              auVar59 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar29 + 0x10 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar29 + 0x18 + lVar26)));
              auVar47 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar29 + 0x14 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar29 + 0x1c + lVar26)));
              auVar110 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar29 + 0x14 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar29 + 0x1c + lVar26)));
              auVar57 = vunpcklps_avx(auVar59,auVar110);
              auVar39 = vunpcklps_avx(auVar111,auVar47);
              auVar47 = vunpckhps_avx(auVar111,auVar47);
              auVar111 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar29 + 0x20 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar29 + 0x28 + lVar26)));
              auVar59 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar29 + 0x20 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar29 + 0x28 + lVar26)));
              auVar56 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar29 + 0x24 + lVar26)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar29 + 0x2c + lVar26)));
              auVar110 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar29 + 0x24 + lVar26)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar29 + 0x2c + lVar26)));
              auVar40 = vunpcklps_avx(auVar59,auVar110);
              auVar50 = vunpcklps_avx(auVar111,auVar56);
              auVar56 = vunpckhps_avx(auVar111,auVar56);
              puVar1 = (undefined8 *)(uVar29 + 0x30 + lVar26);
              local_898 = *puVar1;
              uStack_890 = puVar1[1];
              puVar1 = (undefined8 *)(uVar29 + 0x40 + lVar26);
              local_8a8 = *puVar1;
              uStack_8a0 = puVar1[1];
              uVar33 = *(undefined4 *)&(ray->org).field_0;
              auVar130._4_4_ = uVar33;
              auVar130._0_4_ = uVar33;
              auVar130._8_4_ = uVar33;
              auVar130._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar139._4_4_ = uVar33;
              auVar139._0_4_ = uVar33;
              auVar139._8_4_ = uVar33;
              auVar139._12_4_ = uVar33;
              uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar144._4_4_ = uVar33;
              auVar144._0_4_ = uVar33;
              auVar144._8_4_ = uVar33;
              auVar144._12_4_ = uVar33;
              auVar59 = vsubps_avx(auVar49,auVar130);
              auVar38 = vsubps_avx(auVar38,auVar139);
              auVar110 = vsubps_avx(auVar48,auVar144);
              auVar111 = vsubps_avx(auVar39,auVar130);
              auVar47 = vsubps_avx(auVar47,auVar139);
              auVar48 = vsubps_avx(auVar57,auVar144);
              auVar49 = vsubps_avx(auVar50,auVar130);
              auVar56 = vsubps_avx(auVar56,auVar139);
              auVar57 = vsubps_avx(auVar40,auVar144);
              auVar39 = vsubps_avx(auVar49,auVar59);
              auVar40 = vsubps_avx(auVar56,auVar38);
              auVar50 = vsubps_avx(auVar57,auVar110);
              fVar13 = auVar38._0_4_;
              fVar81 = auVar56._0_4_ + fVar13;
              fVar76 = auVar38._4_4_;
              fVar87 = auVar56._4_4_ + fVar76;
              fVar15 = auVar38._8_4_;
              fVar89 = auVar56._8_4_ + fVar15;
              fVar18 = auVar38._12_4_;
              fVar91 = auVar56._12_4_ + fVar18;
              fVar14 = auVar110._0_4_;
              fVar93 = auVar57._0_4_ + fVar14;
              fVar78 = auVar110._4_4_;
              fVar102 = auVar57._4_4_ + fVar78;
              fVar16 = auVar110._8_4_;
              fVar103 = auVar57._8_4_ + fVar16;
              fVar19 = auVar110._12_4_;
              fVar105 = auVar57._12_4_ + fVar19;
              fVar66 = auVar50._0_4_;
              auVar120._0_4_ = fVar66 * fVar81;
              fVar44 = auVar50._4_4_;
              auVar120._4_4_ = fVar44 * fVar87;
              fVar45 = auVar50._8_4_;
              auVar120._8_4_ = fVar45 * fVar89;
              fVar46 = auVar50._12_4_;
              auVar120._12_4_ = fVar46 * fVar91;
              fVar149 = auVar40._0_4_;
              auVar131._0_4_ = fVar149 * fVar93;
              fVar150 = auVar40._4_4_;
              auVar131._4_4_ = fVar150 * fVar102;
              fVar151 = auVar40._8_4_;
              auVar131._8_4_ = fVar151 * fVar103;
              fVar152 = auVar40._12_4_;
              auVar131._12_4_ = fVar152 * fVar105;
              auVar40 = vsubps_avx(auVar131,auVar120);
              fVar67 = auVar59._0_4_;
              fVar118 = auVar49._0_4_ + fVar67;
              fVar80 = auVar59._4_4_;
              fVar124 = auVar49._4_4_ + fVar80;
              fVar17 = auVar59._8_4_;
              fVar126 = auVar49._8_4_ + fVar17;
              fVar20 = auVar59._12_4_;
              fVar128 = auVar49._12_4_ + fVar20;
              fVar143 = auVar39._0_4_;
              auVar98._0_4_ = fVar143 * fVar93;
              fVar146 = auVar39._4_4_;
              auVar98._4_4_ = fVar146 * fVar102;
              fVar147 = auVar39._8_4_;
              auVar98._8_4_ = fVar147 * fVar103;
              fVar148 = auVar39._12_4_;
              auVar98._12_4_ = fVar148 * fVar105;
              auVar132._0_4_ = fVar118 * fVar66;
              auVar132._4_4_ = fVar124 * fVar44;
              auVar132._8_4_ = fVar126 * fVar45;
              auVar132._12_4_ = fVar128 * fVar46;
              auVar39 = vsubps_avx(auVar132,auVar98);
              auVar121._0_4_ = fVar149 * fVar118;
              auVar121._4_4_ = fVar150 * fVar124;
              auVar121._8_4_ = fVar151 * fVar126;
              auVar121._12_4_ = fVar152 * fVar128;
              auVar85._0_4_ = fVar143 * fVar81;
              auVar85._4_4_ = fVar146 * fVar87;
              auVar85._8_4_ = fVar147 * fVar89;
              auVar85._12_4_ = fVar148 * fVar91;
              auVar50 = vsubps_avx(auVar85,auVar121);
              fVar81 = (ray->dir).field_0.m128[2];
              local_ae8._4_4_ = (ray->dir).field_0.m128[1];
              fVar87 = (ray->dir).field_0.m128[0];
              local_af8._0_4_ =
                   auVar40._0_4_ * fVar87 + local_ae8._4_4_ * auVar39._0_4_ + fVar81 * auVar50._0_4_
              ;
              local_af8._4_4_ =
                   auVar40._4_4_ * fVar87 + local_ae8._4_4_ * auVar39._4_4_ + fVar81 * auVar50._4_4_
              ;
              local_af8._8_4_ =
                   auVar40._8_4_ * fVar87 + local_ae8._4_4_ * auVar39._8_4_ + fVar81 * auVar50._8_4_
              ;
              local_af8._12_4_ =
                   auVar40._12_4_ * fVar87 +
                   local_ae8._4_4_ * auVar39._12_4_ + fVar81 * auVar50._12_4_;
              auVar38 = vsubps_avx(auVar38,auVar47);
              auVar110 = vsubps_avx(auVar110,auVar48);
              fVar91 = fVar13 + auVar47._0_4_;
              fVar102 = fVar76 + auVar47._4_4_;
              fVar105 = fVar15 + auVar47._8_4_;
              fVar124 = fVar18 + auVar47._12_4_;
              fVar126 = auVar48._0_4_ + fVar14;
              fVar128 = auVar48._4_4_ + fVar78;
              fVar104 = auVar48._8_4_ + fVar16;
              fVar106 = auVar48._12_4_ + fVar19;
              fVar133 = auVar110._0_4_;
              auVar145._0_4_ = fVar133 * fVar91;
              fVar134 = auVar110._4_4_;
              auVar145._4_4_ = fVar134 * fVar102;
              fVar135 = auVar110._8_4_;
              auVar145._8_4_ = fVar135 * fVar105;
              fVar136 = auVar110._12_4_;
              auVar145._12_4_ = fVar136 * fVar124;
              fVar89 = auVar38._0_4_;
              auVar69._0_4_ = fVar89 * fVar126;
              fVar93 = auVar38._4_4_;
              auVar69._4_4_ = fVar93 * fVar128;
              fVar103 = auVar38._8_4_;
              auVar69._8_4_ = fVar103 * fVar104;
              fVar118 = auVar38._12_4_;
              auVar69._12_4_ = fVar118 * fVar106;
              auVar38 = vsubps_avx(auVar69,auVar145);
              auVar59 = vsubps_avx(auVar59,auVar111);
              fVar138 = auVar59._0_4_;
              auVar99._0_4_ = fVar138 * fVar126;
              fVar140 = auVar59._4_4_;
              auVar99._4_4_ = fVar140 * fVar128;
              fVar141 = auVar59._8_4_;
              auVar99._8_4_ = fVar141 * fVar104;
              fVar142 = auVar59._12_4_;
              auVar99._12_4_ = fVar142 * fVar106;
              fVar126 = auVar111._0_4_ + fVar67;
              fVar128 = auVar111._4_4_ + fVar80;
              fVar104 = auVar111._8_4_ + fVar17;
              fVar106 = auVar111._12_4_ + fVar20;
              auVar122._0_4_ = fVar133 * fVar126;
              auVar122._4_4_ = fVar134 * fVar128;
              auVar122._8_4_ = fVar135 * fVar104;
              auVar122._12_4_ = fVar136 * fVar106;
              auVar59 = vsubps_avx(auVar122,auVar99);
              auVar112._0_4_ = fVar89 * fVar126;
              auVar112._4_4_ = fVar93 * fVar128;
              auVar112._8_4_ = fVar103 * fVar104;
              auVar112._12_4_ = fVar118 * fVar106;
              auVar86._0_4_ = fVar138 * fVar91;
              auVar86._4_4_ = fVar140 * fVar102;
              auVar86._8_4_ = fVar141 * fVar105;
              auVar86._12_4_ = fVar142 * fVar124;
              auVar110 = vsubps_avx(auVar86,auVar112);
              local_878._0_4_ =
                   fVar87 * auVar38._0_4_ +
                   local_ae8._4_4_ * auVar59._0_4_ + fVar81 * auVar110._0_4_;
              local_878._4_4_ =
                   fVar87 * auVar38._4_4_ +
                   local_ae8._4_4_ * auVar59._4_4_ + fVar81 * auVar110._4_4_;
              local_878._8_4_ =
                   fVar87 * auVar38._8_4_ +
                   local_ae8._4_4_ * auVar59._8_4_ + fVar81 * auVar110._8_4_;
              local_878._12_4_ =
                   fVar87 * auVar38._12_4_ +
                   local_ae8._4_4_ * auVar59._12_4_ + fVar81 * auVar110._12_4_;
              auVar59 = vsubps_avx(auVar111,auVar49);
              fVar65 = auVar111._0_4_ + auVar49._0_4_;
              fVar75 = auVar111._4_4_ + auVar49._4_4_;
              fVar77 = auVar111._8_4_ + auVar49._8_4_;
              fVar79 = auVar111._12_4_ + auVar49._12_4_;
              auVar38 = vsubps_avx(auVar47,auVar56);
              fVar126 = auVar56._0_4_ + auVar47._0_4_;
              fVar128 = auVar56._4_4_ + auVar47._4_4_;
              fVar104 = auVar56._8_4_ + auVar47._8_4_;
              fVar106 = auVar56._12_4_ + auVar47._12_4_;
              auVar110 = vsubps_avx(auVar48,auVar57);
              fVar91 = auVar48._0_4_ + auVar57._0_4_;
              fVar102 = auVar48._4_4_ + auVar57._4_4_;
              fVar105 = auVar48._8_4_ + auVar57._8_4_;
              fVar124 = auVar48._12_4_ + auVar57._12_4_;
              fVar82 = auVar110._0_4_;
              auVar50._0_4_ = fVar82 * fVar126;
              fVar88 = auVar110._4_4_;
              auVar50._4_4_ = fVar88 * fVar128;
              fVar90 = auVar110._8_4_;
              auVar50._8_4_ = fVar90 * fVar104;
              fVar92 = auVar110._12_4_;
              auVar50._12_4_ = fVar92 * fVar106;
              fVar119 = auVar38._0_4_;
              auVar113._0_4_ = fVar119 * fVar91;
              fVar125 = auVar38._4_4_;
              auVar113._4_4_ = fVar125 * fVar102;
              fVar127 = auVar38._8_4_;
              auVar113._8_4_ = fVar127 * fVar105;
              fVar129 = auVar38._12_4_;
              auVar113._12_4_ = fVar129 * fVar124;
              auVar38 = vsubps_avx(auVar113,auVar50);
              fVar94 = auVar59._0_4_;
              auVar39._0_4_ = fVar94 * fVar91;
              fVar91 = auVar59._4_4_;
              auVar39._4_4_ = fVar91 * fVar102;
              fVar102 = auVar59._8_4_;
              auVar39._8_4_ = fVar102 * fVar105;
              fVar105 = auVar59._12_4_;
              auVar39._12_4_ = fVar105 * fVar124;
              auVar114._0_4_ = fVar82 * fVar65;
              auVar114._4_4_ = fVar88 * fVar75;
              auVar114._8_4_ = fVar90 * fVar77;
              auVar114._12_4_ = fVar92 * fVar79;
              auVar59 = vsubps_avx(auVar114,auVar39);
              auVar117 = ZEXT1664(local_a98);
              auVar70._0_4_ = fVar119 * fVar65;
              auVar70._4_4_ = fVar125 * fVar75;
              auVar70._8_4_ = fVar127 * fVar77;
              auVar70._12_4_ = fVar129 * fVar79;
              auVar58._0_4_ = fVar94 * fVar126;
              auVar58._4_4_ = fVar91 * fVar128;
              auVar58._8_4_ = fVar102 * fVar104;
              auVar58._12_4_ = fVar105 * fVar106;
              auVar110 = vsubps_avx(auVar58,auVar70);
              local_ae8._0_4_ = local_ae8._4_4_;
              fStack_ae0 = local_ae8._4_4_;
              fStack_adc = local_ae8._4_4_;
              auVar40._0_4_ =
                   fVar87 * auVar38._0_4_ +
                   local_ae8._4_4_ * auVar59._0_4_ + fVar81 * auVar110._0_4_;
              auVar40._4_4_ =
                   fVar87 * auVar38._4_4_ +
                   local_ae8._4_4_ * auVar59._4_4_ + fVar81 * auVar110._4_4_;
              auVar40._8_4_ =
                   fVar87 * auVar38._8_4_ +
                   local_ae8._4_4_ * auVar59._8_4_ + fVar81 * auVar110._8_4_;
              auVar40._12_4_ =
                   fVar87 * auVar38._12_4_ +
                   local_ae8._4_4_ * auVar59._12_4_ + fVar81 * auVar110._12_4_;
              local_868._0_4_ = auVar40._0_4_ + local_af8._0_4_ + local_878._0_4_;
              local_868._4_4_ = auVar40._4_4_ + local_af8._4_4_ + local_878._4_4_;
              local_868._8_4_ = auVar40._8_4_ + local_af8._8_4_ + local_878._8_4_;
              local_868._12_4_ = auVar40._12_4_ + local_af8._12_4_ + local_878._12_4_;
              auVar59 = vminps_avx(local_af8,local_878);
              auVar38 = vminps_avx(auVar59,auVar40);
              auVar59._8_4_ = 0x7fffffff;
              auVar59._0_8_ = 0x7fffffff7fffffff;
              auVar59._12_4_ = 0x7fffffff;
              auVar59 = vandps_avx(local_868,auVar59);
              auVar60._0_4_ = auVar59._0_4_ * 1.1920929e-07;
              auVar60._4_4_ = auVar59._4_4_ * 1.1920929e-07;
              auVar60._8_4_ = auVar59._8_4_ * 1.1920929e-07;
              auVar60._12_4_ = auVar59._12_4_ * 1.1920929e-07;
              uVar31 = CONCAT44(auVar60._4_4_,auVar60._0_4_);
              auVar71._0_8_ = uVar31 ^ 0x8000000080000000;
              auVar71._8_4_ = -auVar60._8_4_;
              auVar71._12_4_ = -auVar60._12_4_;
              auVar38 = vcmpps_avx(auVar38,auVar71,5);
              auVar110 = vmaxps_avx(local_af8,local_878);
              auVar110 = vmaxps_avx(auVar110,auVar40);
              auVar110 = vcmpps_avx(auVar110,auVar60,2);
              auVar38 = vorps_avx(auVar38,auVar110);
              mapUV = (UVIdentity<4>)0x0;
              local_858 = &mapUV;
              auVar110 = auVar24 & auVar38;
              if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar110[0xf] < '\0') {
                auVar41._0_4_ = fVar89 * fVar66;
                auVar41._4_4_ = fVar93 * fVar44;
                auVar41._8_4_ = fVar103 * fVar45;
                auVar41._12_4_ = fVar118 * fVar46;
                auVar51._0_4_ = fVar149 * fVar133;
                auVar51._4_4_ = fVar150 * fVar134;
                auVar51._8_4_ = fVar151 * fVar135;
                auVar51._12_4_ = fVar152 * fVar136;
                auVar47 = vsubps_avx(auVar51,auVar41);
                auVar61._0_4_ = fVar133 * fVar119;
                auVar61._4_4_ = fVar134 * fVar125;
                auVar61._8_4_ = fVar135 * fVar127;
                auVar61._12_4_ = fVar136 * fVar129;
                auVar72._0_4_ = fVar89 * fVar82;
                auVar72._4_4_ = fVar93 * fVar88;
                auVar72._8_4_ = fVar103 * fVar90;
                auVar72._12_4_ = fVar118 * fVar92;
                auVar48 = vsubps_avx(auVar72,auVar61);
                auVar137._8_4_ = 0x7fffffff;
                auVar137._0_8_ = 0x7fffffff7fffffff;
                auVar137._12_4_ = 0x7fffffff;
                auVar110 = vandps_avx(auVar137,auVar41);
                auVar111 = vandps_avx(auVar137,auVar61);
                auVar110 = vcmpps_avx(auVar110,auVar111,1);
                local_808 = vblendvps_avx(auVar48,auVar47,auVar110);
                auVar52._0_4_ = fVar138 * fVar82;
                auVar52._4_4_ = fVar140 * fVar88;
                auVar52._8_4_ = fVar141 * fVar90;
                auVar52._12_4_ = fVar142 * fVar92;
                auVar62._0_4_ = fVar138 * fVar66;
                auVar62._4_4_ = fVar140 * fVar44;
                auVar62._8_4_ = fVar141 * fVar45;
                auVar62._12_4_ = fVar142 * fVar46;
                auVar73._0_4_ = fVar133 * fVar143;
                auVar73._4_4_ = fVar134 * fVar146;
                auVar73._8_4_ = fVar135 * fVar147;
                auVar73._12_4_ = fVar136 * fVar148;
                auVar47 = vsubps_avx(auVar62,auVar73);
                auVar107._0_4_ = fVar133 * fVar94;
                auVar107._4_4_ = fVar134 * fVar91;
                auVar107._8_4_ = fVar135 * fVar102;
                auVar107._12_4_ = fVar136 * fVar105;
                auVar48 = vsubps_avx(auVar107,auVar52);
                auVar110 = vandps_avx(auVar137,auVar73);
                auVar111 = vandps_avx(auVar137,auVar52);
                auVar110 = vcmpps_avx(auVar110,auVar111,1);
                local_7f8 = vblendvps_avx(auVar48,auVar47,auVar110);
                auVar63._0_4_ = fVar89 * fVar94;
                auVar63._4_4_ = fVar93 * fVar91;
                auVar63._8_4_ = fVar103 * fVar102;
                auVar63._12_4_ = fVar118 * fVar105;
                auVar74._0_4_ = fVar89 * fVar143;
                auVar74._4_4_ = fVar93 * fVar146;
                auVar74._8_4_ = fVar103 * fVar147;
                auVar74._12_4_ = fVar118 * fVar148;
                auVar100._0_4_ = fVar149 * fVar138;
                auVar100._4_4_ = fVar150 * fVar140;
                auVar100._8_4_ = fVar151 * fVar141;
                auVar100._12_4_ = fVar152 * fVar142;
                auVar108._0_4_ = fVar138 * fVar119;
                auVar108._4_4_ = fVar140 * fVar125;
                auVar108._8_4_ = fVar141 * fVar127;
                auVar108._12_4_ = fVar142 * fVar129;
                auVar47 = vsubps_avx(auVar74,auVar100);
                auVar48 = vsubps_avx(auVar108,auVar63);
                auVar110 = vandps_avx(auVar137,auVar100);
                auVar111 = vandps_avx(auVar137,auVar63);
                auVar110 = vcmpps_avx(auVar110,auVar111,1);
                local_7e8 = vblendvps_avx(auVar48,auVar47,auVar110);
                fVar66 = fVar87 * local_808._0_4_ +
                         local_7f8._0_4_ * local_ae8._4_4_ + local_7e8._0_4_ * fVar81;
                fVar89 = fVar87 * local_808._4_4_ +
                         local_7f8._4_4_ * local_ae8._4_4_ + local_7e8._4_4_ * fVar81;
                fVar91 = fVar87 * local_808._8_4_ +
                         local_7f8._8_4_ * local_ae8._4_4_ + local_7e8._8_4_ * fVar81;
                fVar81 = fVar87 * local_808._12_4_ +
                         local_7f8._12_4_ * local_ae8._4_4_ + local_7e8._12_4_ * fVar81;
                auVar101._0_4_ = fVar66 + fVar66;
                auVar101._4_4_ = fVar89 + fVar89;
                auVar101._8_4_ = fVar91 + fVar91;
                auVar101._12_4_ = fVar81 + fVar81;
                fVar67 = local_808._0_4_ * fVar67 +
                         local_7f8._0_4_ * fVar13 + local_7e8._0_4_ * fVar14;
                fVar76 = local_808._4_4_ * fVar80 +
                         local_7f8._4_4_ * fVar76 + local_7e8._4_4_ * fVar78;
                fVar78 = local_808._8_4_ * fVar17 +
                         local_7f8._8_4_ * fVar15 + local_7e8._8_4_ * fVar16;
                fVar80 = local_808._12_4_ * fVar20 +
                         local_7f8._12_4_ * fVar18 + local_7e8._12_4_ * fVar19;
                auVar110 = vrcpps_avx(auVar101);
                fVar81 = auVar110._0_4_;
                auVar115._0_4_ = auVar101._0_4_ * fVar81;
                fVar87 = auVar110._4_4_;
                auVar115._4_4_ = auVar101._4_4_ * fVar87;
                fVar13 = auVar110._8_4_;
                auVar115._8_4_ = auVar101._8_4_ * fVar13;
                fVar14 = auVar110._12_4_;
                auVar115._12_4_ = auVar101._12_4_ * fVar14;
                auVar123._8_4_ = 0x3f800000;
                auVar123._0_8_ = &DAT_3f8000003f800000;
                auVar123._12_4_ = 0x3f800000;
                auVar110 = vsubps_avx(auVar123,auVar115);
                local_818._0_4_ = (fVar67 + fVar67) * (fVar81 + fVar81 * auVar110._0_4_);
                local_818._4_4_ = (fVar76 + fVar76) * (fVar87 + fVar87 * auVar110._4_4_);
                local_818._8_4_ = (fVar78 + fVar78) * (fVar13 + fVar13 * auVar110._8_4_);
                local_818._12_4_ = (fVar80 + fVar80) * (fVar14 + fVar14 * auVar110._12_4_);
                uVar33 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar109._4_4_ = uVar33;
                auVar109._0_4_ = uVar33;
                auVar109._8_4_ = uVar33;
                auVar109._12_4_ = uVar33;
                auVar110 = vcmpps_avx(auVar109,local_818,2);
                fVar81 = ray->tfar;
                auVar116._4_4_ = fVar81;
                auVar116._0_4_ = fVar81;
                auVar116._8_4_ = fVar81;
                auVar116._12_4_ = fVar81;
                auVar111 = vcmpps_avx(local_818,auVar116,2);
                auVar110 = vandps_avx(auVar110,auVar111);
                auVar117 = ZEXT1664(local_a98);
                auVar111 = vcmpps_avx(auVar101,_DAT_01feba10,4);
                auVar110 = vandps_avx(auVar111,auVar110);
                auVar38 = vandps_avx(auVar38,auVar24);
                auVar110 = vpslld_avx(auVar110,0x1f);
                auVar111 = vpsrad_avx(auVar110,0x1f);
                auVar110 = auVar38 & auVar111;
                if ((((auVar110 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar110 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar110 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar110[0xf] < '\0') {
                  local_848 = vandps_avx(auVar111,auVar38);
                  local_888 = local_af8;
                  auVar38 = vrcpps_avx(local_868);
                  fVar81 = auVar38._0_4_;
                  auVar53._0_4_ = local_868._0_4_ * fVar81;
                  fVar87 = auVar38._4_4_;
                  auVar53._4_4_ = local_868._4_4_ * fVar87;
                  fVar13 = auVar38._8_4_;
                  auVar53._8_4_ = local_868._8_4_ * fVar13;
                  fVar14 = auVar38._12_4_;
                  auVar53._12_4_ = local_868._12_4_ * fVar14;
                  auVar64._8_4_ = 0x3f800000;
                  auVar64._0_8_ = &DAT_3f8000003f800000;
                  auVar64._12_4_ = 0x3f800000;
                  auVar38 = vsubps_avx(auVar64,auVar53);
                  auVar42._0_4_ = fVar81 + fVar81 * auVar38._0_4_;
                  auVar42._4_4_ = fVar87 + fVar87 * auVar38._4_4_;
                  auVar42._8_4_ = fVar13 + fVar13 * auVar38._8_4_;
                  auVar42._12_4_ = fVar14 + fVar14 * auVar38._12_4_;
                  auVar54._8_4_ = 0x219392ef;
                  auVar54._0_8_ = 0x219392ef219392ef;
                  auVar54._12_4_ = 0x219392ef;
                  auVar59 = vcmpps_avx(auVar59,auVar54,5);
                  auVar59 = vandps_avx(auVar59,auVar42);
                  auVar55._0_4_ = local_af8._0_4_ * auVar59._0_4_;
                  auVar55._4_4_ = local_af8._4_4_ * auVar59._4_4_;
                  auVar55._8_4_ = local_af8._8_4_ * auVar59._8_4_;
                  auVar55._12_4_ = local_af8._12_4_ * auVar59._12_4_;
                  local_838 = vminps_avx(auVar55,auVar64);
                  auVar43._0_4_ = local_878._0_4_ * auVar59._0_4_;
                  auVar43._4_4_ = local_878._4_4_ * auVar59._4_4_;
                  auVar43._8_4_ = local_878._8_4_ * auVar59._8_4_;
                  auVar43._12_4_ = local_878._12_4_ * auVar59._12_4_;
                  local_828 = vminps_avx(auVar43,auVar64);
                  uVar33 = vmovmskps_avx(local_848);
                  uVar34 = CONCAT44((int)(uVar34 >> 0x20),uVar33);
                  do {
                    uVar31 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_898 + uVar31 * 4);
                    pGVar11 = (pSVar5->geometries).items[h.geomID].ptr;
                    if ((pGVar11->mask & ray->mask) == 0) {
                      uVar34 = uVar34 ^ 1L << (uVar31 & 0x3f);
                      bVar23 = true;
                    }
                    else {
                      pRVar12 = context->args;
                      if ((pRVar12->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar23 = false;
                      }
                      else {
                        h.u = *(float *)(local_838 + uVar31 * 4);
                        h.v = *(float *)(local_828 + uVar31 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)((long)&local_8a8 + uVar31 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar31 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar31 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar31 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar81 = ray->tfar;
                        ray->tfar = *(float *)(local_818 + uVar31 * 4);
                        local_afc = -1;
                        args.valid = &local_afc;
                        args.geometryUserPtr = pGVar11->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002d8456:
                          if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar12->filter)(&args);
                              auVar117 = ZEXT1664(local_a98);
                            }
                            if (*args.valid == 0) goto LAB_002d84ab;
                          }
                          bVar23 = false;
                        }
                        else {
                          local_ae8 = context;
                          local_af8._0_8_ = ray;
                          (*pGVar11->occlusionFilterN)(&args);
                          auVar117 = ZEXT1664(local_a98);
                          ray = (Ray *)local_af8._0_8_;
                          context = local_ae8;
                          if (*args.valid != 0) goto LAB_002d8456;
LAB_002d84ab:
                          ray->tfar = fVar81;
                          uVar34 = uVar34 ^ 1L << (uVar31 & 0x3f);
                          bVar23 = true;
                        }
                      }
                    }
                    iVar30 = 0;
                    if (!bVar23) {
                      uVar31 = local_aa0;
                      uVar32 = local_aa8;
                      uVar28 = local_ac0;
                      uVar35 = local_ab0;
                      uVar36 = local_ab8;
                      if (bVar37) {
                        ray->tfar = -INFINITY;
                        iVar30 = 3;
                      }
                      goto LAB_002d8535;
                    }
                  } while (uVar34 != 0);
                  uVar34 = 0;
                }
              }
              iVar30 = 0;
              local_a80 = local_a80 + 1;
              bVar37 = local_a80 < local_a88;
              uVar31 = local_aa0;
              uVar32 = local_aa8;
              uVar28 = local_ac0;
              uVar35 = local_ab0;
              uVar36 = local_ab8;
            } while (local_a80 != local_a88);
          }
        }
LAB_002d8535:
        uVar34 = uVar28;
      } while (iVar30 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }